

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

RE2 * __thiscall re2::RE2::QuoteMeta_abi_cxx11_(RE2 *this,StringPiece *unquoted)

{
  char cVar1;
  int iVar2;
  int local_30;
  int ii;
  StringPiece *unquoted_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  StringPiece::size(unquoted);
  std::__cxx11::string::reserve((ulong)this);
  local_30 = 0;
  do {
    iVar2 = StringPiece::length(unquoted);
    if (iVar2 <= local_30) {
      return this;
    }
    cVar1 = StringPiece::operator[](unquoted,local_30);
    if (((((cVar1 < 'a') || (cVar1 = StringPiece::operator[](unquoted,local_30), 'z' < cVar1)) &&
         ((cVar1 = StringPiece::operator[](unquoted,local_30), cVar1 < 'A' ||
          (cVar1 = StringPiece::operator[](unquoted,local_30), 'Z' < cVar1)))) &&
        (((cVar1 = StringPiece::operator[](unquoted,local_30), cVar1 < '0' ||
          (cVar1 = StringPiece::operator[](unquoted,local_30), '9' < cVar1)) &&
         (cVar1 = StringPiece::operator[](unquoted,local_30), cVar1 != '_')))) &&
       (cVar1 = StringPiece::operator[](unquoted,local_30), ((int)cVar1 & 0x80U) == 0)) {
      cVar1 = StringPiece::operator[](unquoted,local_30);
      if (cVar1 != '\0') {
        std::__cxx11::string::operator+=((string *)this,'\\');
        goto LAB_00146aa8;
      }
      std::__cxx11::string::operator+=((string *)this,"\\x00");
    }
    else {
LAB_00146aa8:
      cVar1 = StringPiece::operator[](unquoted,local_30);
      std::__cxx11::string::operator+=((string *)this,cVar1);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

string RE2::QuoteMeta(const StringPiece& unquoted) {
  string result;
  result.reserve(unquoted.size() << 1);

  // Escape any ascii character not in [A-Za-z_0-9].
  //
  // Note that it's legal to escape a character even if it has no
  // special meaning in a regular expression -- so this function does
  // that.  (This also makes it identical to the perl function of the
  // same name except for the null-character special case;
  // see `perldoc -f quotemeta`.)
  for (int ii = 0; ii < unquoted.length(); ++ii) {
    // Note that using 'isalnum' here raises the benchmark time from
    // 32ns to 58ns:
    if ((unquoted[ii] < 'a' || unquoted[ii] > 'z') &&
        (unquoted[ii] < 'A' || unquoted[ii] > 'Z') &&
        (unquoted[ii] < '0' || unquoted[ii] > '9') &&
        unquoted[ii] != '_' &&
        // If this is the part of a UTF8 or Latin1 character, we need
        // to copy this byte without escaping.  Experimentally this is
        // what works correctly with the regexp library.
        !(unquoted[ii] & 128)) {
      if (unquoted[ii] == '\0') {  // Special handling for null chars.
        // Note that this special handling is not strictly required for RE2,
        // but this quoting is required for other regexp libraries such as
        // PCRE.
        // Can't use "\\0" since the next character might be a digit.
        result += "\\x00";
        continue;
      }
      result += '\\';
    }
    result += unquoted[ii];
  }

  return result;
}